

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:310:32)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:310:32)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  char cVar2;
  int iVar3;
  runtime_error *this_01;
  string line;
  FileName listFilename;
  ifstream listFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  FileName local_278;
  FileName local_258;
  FileName local_238;
  byte abStack_218 [488];
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getFileName(&local_238,this_00);
  FileName::operator+(&local_278,path,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.filename._M_dataplus._M_p != &local_238.filename.field_2) {
    operator_delete(local_238.filename._M_dataplus._M_p);
  }
  std::ifstream::ifstream(&local_238);
  std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_278.filename._M_dataplus._M_p);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    if ((abStack_218[*(long *)(local_238.filename._M_dataplus._M_p + -0x18)] & 2) == 0) {
      do {
        local_298._M_string_length = 0;
        local_298.field_2._M_local_buf[0] = '\0';
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::operator>>((istream *)&local_238,(string *)&local_298);
        iVar3 = std::__cxx11::string::compare((char *)&local_298);
        if (iVar3 != 0) {
          FileName::path(&local_258,&local_278);
          FileName::operator+((FileName *)&local_2b8,&local_258,&local_298);
          std::vector<embree::FileName,_std::allocator<embree::FileName>_>::
          emplace_back<embree::FileName>(&pSVar1->keyFramesFilenames,(FileName *)&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258.filename._M_dataplus._M_p != &local_258.filename.field_2) {
            operator_delete(local_258.filename._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
      } while ((abStack_218[*(long *)(local_238.filename._M_dataplus._M_p + -0x18)] & 2) == 0);
    }
    std::ifstream::~ifstream(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.filename._M_dataplus._M_p != &local_278.filename.field_2) {
      operator_delete(local_278.filename._M_dataplus._M_p);
    }
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])();
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_278.filename._M_dataplus._M_p,
             local_278.filename._M_dataplus._M_p + local_278.filename._M_string_length);
  std::operator+(&local_298,"cannot open ",&local_2b8);
  std::runtime_error::runtime_error(this_01,(string *)&local_298);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }